

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O0

void Cec_ManFraCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vCiInfo,Vec_Ptr_t *vInfo,int nSeries)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int local_40;
  int local_3c;
  int w;
  int i;
  uint *pRes1;
  uint *pRes0;
  int nSeries_local;
  Vec_Ptr_t *vInfo_local;
  Vec_Ptr_t *vCiInfo_local;
  Cec_ManSim_t *p_local;
  
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManCiNum(p->pAig);
    if (iVar1 <= local_3c) break;
    pvVar2 = Vec_PtrEntry(vCiInfo,local_3c);
    pvVar3 = Vec_PtrEntry(vInfo,local_3c);
    iVar1 = p->nWords;
    for (local_40 = 0; local_40 < p->nWords; local_40 = local_40 + 1) {
      *(undefined4 *)((long)pvVar2 + (long)local_40 * 4) =
           *(undefined4 *)((long)pvVar3 + (long)local_40 * 4 + (long)(iVar1 * nSeries) * 4);
    }
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void Cec_ManFraCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vCiInfo, Vec_Ptr_t * vInfo, int nSeries )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pRes0 = (unsigned *)Vec_PtrEntry( vCiInfo, i );
        pRes1 = (unsigned *)Vec_PtrEntry( vInfo, i );
        pRes1 += p->nWords * nSeries;
        for ( w = 0; w < p->nWords; w++ )
            pRes0[w] = pRes1[w];
    }
}